

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void get_cost_surf_min(int *cost_list,int *ir,int *ic,int bits)

{
  int iVar1;
  char in_CL;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  iVar1 = divide_and_round((in_RDI[1] - in_RDI[3]) * (1 << (in_CL - 1U & 0x1f)),
                           in_RDI[1] + *in_RDI * -2 + in_RDI[3]);
  *in_RDX = iVar1;
  iVar1 = divide_and_round((in_RDI[4] - in_RDI[2]) * (1 << (in_CL - 1U & 0x1f)),
                           in_RDI[4] + *in_RDI * -2 + in_RDI[2]);
  *in_RSI = iVar1;
  return;
}

Assistant:

static inline void get_cost_surf_min(const int *cost_list, int *ir, int *ic,
                                     int bits) {
  *ic = divide_and_round((cost_list[1] - cost_list[3]) * (1 << (bits - 1)),
                         (cost_list[1] - 2 * cost_list[0] + cost_list[3]));
  *ir = divide_and_round((cost_list[4] - cost_list[2]) * (1 << (bits - 1)),
                         (cost_list[4] - 2 * cost_list[0] + cost_list[2]));
}